

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

bool __thiscall capnp::DynamicStruct::Builder::has(Builder *this,StringPtr name,HasMode mode)

{
  Schema SVar1;
  Field field;
  bool bVar2;
  Reader local_98;
  Field local_60;
  
  StructSchema::getFieldByName(&local_60,&this->schema,name);
  SVar1.raw = (this->schema).super_Schema.raw;
  capnp::_::StructBuilder::asReader(&this->builder);
  field.index = local_60.index;
  field._12_4_ = local_60._12_4_;
  field.parent.super_Schema.raw = local_60.parent.super_Schema.raw;
  field.proto._reader.segment = local_60.proto._reader.segment;
  field.proto._reader.capTable = local_60.proto._reader.capTable;
  field.proto._reader.data = local_60.proto._reader.data;
  field.proto._reader.pointers = local_60.proto._reader.pointers;
  field.proto._reader.dataSize = local_60.proto._reader.dataSize;
  field.proto._reader.pointerCount = local_60.proto._reader.pointerCount;
  field.proto._reader._38_2_ = local_60.proto._reader._38_2_;
  field.proto._reader.nestingLimit = local_60.proto._reader.nestingLimit;
  field.proto._reader._44_4_ = local_60.proto._reader._44_4_;
  local_98.schema.super_Schema.raw = (Schema)(Schema)SVar1.raw;
  bVar2 = DynamicStruct::Reader::has(&local_98,field,mode);
  return bVar2;
}

Assistant:

bool DynamicStruct::Builder::has(kj::StringPtr name, HasMode mode) {
  return has(schema.getFieldByName(name), mode);
}